

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O3

void __thiscall
LiteScript::_Type_CLASS::Save
          (_Type_CLASS *this,ostream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  uint uVar1;
  int iVar2;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *pvVar3;
  Object *pOVar4;
  char *pcVar5;
  size_t sVar6;
  array<LiteScript::Nullable<LiteScript::Variable>,_33UL> *paVar7;
  uint i;
  long *plVar8;
  Class *this_00;
  pointer pVVar9;
  pointer in_R8;
  long lVar10;
  ulong uVar11;
  char local_68;
  pointer local_58;
  uint local_50;
  undefined4 uStack_4c;
  pointer local_48;
  pointer local_40;
  Class *local_38;
  
  local_38 = (Class *)object->data;
  local_58 = (pointer)caller;
  local_48 = (pointer)object;
  local_40 = in_R8;
  pvVar3 = Class::GetInherits(local_38);
  uVar11 = (long)(pvVar3->
                 super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar3->
                 super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  local_68 = (char)(uVar11 >> 4);
  std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xffffffffffffff98,1);
  local_68 = (char)(uVar11 >> 0xc);
  std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xffffffffffffff98,1);
  local_68 = (char)(uVar11 >> 0x14);
  std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xffffffffffffff98,1);
  local_68 = (char)(uVar11 >> 0x1c);
  std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xffffffffffffff98,1);
  uVar11 = (ulong)((long)(pvVar3->
                         super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar3->
                        super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                        )._M_impl.super__Vector_impl_data._M_start) >> 4;
  if ((int)uVar11 != 0) {
    uVar11 = uVar11 & 0xffffffff;
    lVar10 = 0;
    do {
      plVar8 = (long *)((long)(((Memory *)(local_48->second).obj)->arr)._M_elems +
                       (long)&(local_40->first)._M_dataplus);
      pVVar9 = local_58;
      if (((ulong)local_58 & 1) != 0) {
        pVVar9 = *(pointer *)(*plVar8 + -1 + (long)local_58);
      }
      pOVar4 = Variable::operator->
                         ((Variable *)
                          ((long)&((pvVar3->
                                   super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->obj + lVar10));
      (*(code *)pVVar9)(plVar8,stream,pOVar4->ID);
      lVar10 = lVar10 + 0x10;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  this_00 = local_38;
  uVar1 = Class::GetStaticCount(local_38);
  local_68 = (char)uVar1;
  std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xffffffffffffff98,1);
  local_68 = (char)(uVar1 >> 8);
  std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xffffffffffffff98,1);
  local_68 = (char)(uVar1 >> 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xffffffffffffff98,1);
  local_68 = (char)(uVar1 >> 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xffffffffffffff98,1);
  uVar1 = Class::GetStaticCount(this_00);
  _local_50 = (pointer)CONCAT44(uStack_4c,uVar1);
  if (uVar1 != 0) {
    uVar1 = 0;
    do {
      pcVar5 = Class::GetStaticName(this_00,uVar1);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar5,sVar6);
      }
      local_68 = '\0';
      std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xffffffffffffff98,1);
      plVar8 = (long *)((long)(((Memory *)(local_48->second).obj)->arr)._M_elems +
                       (long)&(local_40->first)._M_dataplus);
      pVVar9 = local_58;
      if (((ulong)local_58 & 1) != 0) {
        pVVar9 = *(pointer *)(*plVar8 + -1 + (long)local_58);
      }
      Class::GetStaticMember((Class *)&stack0xffffffffffffff98,(uint)this_00);
      pOVar4 = Variable::operator->((Variable *)&stack0xffffffffffffff98);
      (*(code *)pVVar9)(plVar8,stream,pOVar4->ID);
      Variable::~Variable((Variable *)&stack0xffffffffffffff98);
      uVar1 = uVar1 + 1;
    } while (local_50 != uVar1);
  }
  uVar1 = Class::GetUnstaticCount(this_00);
  local_68 = (char)uVar1;
  std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xffffffffffffff98,1);
  local_68 = (char)(uVar1 >> 8);
  std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xffffffffffffff98,1);
  local_68 = (char)(uVar1 >> 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xffffffffffffff98,1);
  local_68 = (char)(uVar1 >> 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xffffffffffffff98,1);
  uVar1 = Class::GetUnstaticCount(this_00);
  if (uVar1 == 0) {
    _local_50 = (pointer)(ulong)((uint)local_58 & 1);
  }
  else {
    _local_50 = (pointer)(ulong)((uint)local_58 & 1);
    i = 0;
    do {
      pcVar5 = Class::GetUnstaticName(this_00,i);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar5,sVar6);
      }
      local_68 = '\0';
      std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xffffffffffffff98,1);
      plVar8 = (long *)((long)(((Memory *)(local_48->second).obj)->arr)._M_elems +
                       (long)&(local_40->first)._M_dataplus);
      pVVar9 = local_58;
      if (_local_50 != (pointer)0x0) {
        pVVar9 = *(pointer *)(*plVar8 + -1 + (long)local_58);
      }
      Class::GetUnstaticMember((Class *)&stack0xffffffffffffff98,(uint)local_38);
      pOVar4 = Variable::operator->((Variable *)&stack0xffffffffffffff98);
      (*(code *)pVVar9)(plVar8,stream,pOVar4->ID);
      Variable::~Variable((Variable *)&stack0xffffffffffffff98);
      i = i + 1;
      this_00 = local_38;
    } while (uVar1 != i);
  }
  iVar2 = Class::GetConstructorIndex(this_00);
  local_68 = (char)iVar2;
  std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xffffffffffffff98,1);
  local_68 = (char)((uint)iVar2 >> 8);
  std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xffffffffffffff98,1);
  local_68 = (char)((uint)iVar2 >> 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xffffffffffffff98,1);
  local_68 = (char)((uint)iVar2 >> 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xffffffffffffff98,1);
  paVar7 = Class::GetOperators(this_00);
  lVar10 = 0;
  do {
    if (**(char **)(paVar7->_M_elems[0].data + lVar10 + 0x18) == '\x01') {
      local_68 = '\0';
      std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xffffffffffffff98,1);
    }
    else {
      local_68 = '\x01';
      std::__ostream_insert<char,std::char_traits<char>>(stream,&stack0xffffffffffffff98,1);
      plVar8 = (long *)((long)(((Memory *)(local_48->second).obj)->arr)._M_elems +
                       (long)&(local_40->first)._M_dataplus);
      pVVar9 = local_58;
      if (_local_50 != (pointer)0x0) {
        pVVar9 = *(pointer *)(*plVar8 + -1 + (long)local_58);
      }
      pOVar4 = Variable::operator->((Variable *)(paVar7->_M_elems[0].data + lVar10));
      (*(code *)pVVar9)(plVar8,stream,pOVar4->ID);
    }
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0x420);
  return;
}

Assistant:

void LiteScript::_Type_CLASS::Save(std::ostream &stream, Object &object, bool (Memory::*caller)(std::ostream&, unsigned int)) const {
    Class& C = object.GetData<Class>();
    const std::vector<LiteScript::Variable>& inherits = C.GetInherits();
    OStreamer::Write<unsigned int>(stream, inherits.size());
    for (unsigned int i = 0, sz = inherits.size(); i < sz; i++)
        (object.memory.*caller)(stream, inherits[i]->ID);
    OStreamer::Write<unsigned int>(stream, C.GetStaticCount());
    for (unsigned int i = 0, sz = C.GetStaticCount(); i < sz; i++) {
        stream << C.GetStaticName(i) << (uint8_t)0;
        (object.memory.*caller)(stream, C.GetStaticMember(i)->ID);
    }
    OStreamer::Write<unsigned int>(stream, C.GetUnstaticCount());
    for (unsigned int i = 0, sz = C.GetUnstaticCount(); i < sz; i++) {
        stream << C.GetUnstaticName(i) << (uint8_t)0;
        (object.memory.*caller)(stream, C.GetUnstaticMember(i)->ID);
    }
    OStreamer::Write<int>(stream, C.GetConstructorIndex());
    const std::array<Nullable<Variable>, Class::OperatorType::OP_TYPE_NUMBER>& op_list = C.GetOperators();
    for (unsigned int i = 0; i < Class::OperatorType::OP_TYPE_NUMBER; i++) {
        if (op_list[i].isNull)
            stream << (uint8_t)0;
        else {
            stream << (uint8_t)1;
            (object.memory.*caller)(stream, (*op_list[i])->ID);
        }
    }
}